

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_copyCCtx
                 (ZSTD_CCtx *dstCCtx,ZSTD_CCtx *srcCCtx,unsigned_long_long pledgedSrcSize)

{
  ZSTD_buffered_policy_e zbuff;
  ZSTD_strategy ZVar1;
  U32 UVar2;
  void *pvVar3;
  ZSTD_freeFunction p_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  undefined4 uVar10;
  U32 UVar11;
  size_t sVar12;
  size_t __n;
  ZSTD_matchState_t *dstMatchState;
  ulong pledgedSrcSize_00;
  ZSTD_matchState_t *srcMatchState;
  size_t local_110;
  ZSTD_CCtx_params local_108;
  
  sVar12 = 0xffffffffffffffc4;
  if (srcCCtx->stage == ZSTDcs_init) {
    local_110 = 0;
    pledgedSrcSize_00 = -(ulong)(pledgedSrcSize == 0) | pledgedSrcSize;
    zbuff = srcCCtx->bufferedPolicy;
    (dstCCtx->customMem).opaque = (srcCCtx->customMem).opaque;
    p_Var4 = (srcCCtx->customMem).customFree;
    (dstCCtx->customMem).customAlloc = (srcCCtx->customMem).customAlloc;
    (dstCCtx->customMem).customFree = p_Var4;
    switchD_012bc561::default(&local_108,&dstCCtx->requestedParams,0xd8);
    local_108.cParams.windowLog = (srcCCtx->appliedParams).cParams.windowLog;
    local_108.cParams.chainLog = (srcCCtx->appliedParams).cParams.chainLog;
    uVar5 = (srcCCtx->appliedParams).cParams.hashLog;
    uVar6 = (srcCCtx->appliedParams).cParams.searchLog;
    uVar7 = (srcCCtx->appliedParams).cParams.minMatch;
    local_108.cParams.targetLength = (srcCCtx->appliedParams).cParams.targetLength;
    local_108.cParams.strategy = (srcCCtx->appliedParams).cParams.strategy;
    local_108.useBlockSplitter = (srcCCtx->appliedParams).useBlockSplitter;
    local_108.useRowMatchFinder = (srcCCtx->appliedParams).useRowMatchFinder;
    local_108.ldmParams.enableLdm = (srcCCtx->appliedParams).ldmParams.enableLdm;
    local_108.ldmParams.hashLog = (srcCCtx->appliedParams).ldmParams.hashLog;
    local_108.ldmParams.bucketSizeLog = (srcCCtx->appliedParams).ldmParams.bucketSizeLog;
    local_108.ldmParams.minMatchLength = (srcCCtx->appliedParams).ldmParams.minMatchLength;
    local_108.ldmParams.hashRateLog = (srcCCtx->appliedParams).ldmParams.hashRateLog;
    local_108.ldmParams.windowLog = (srcCCtx->appliedParams).ldmParams.windowLog;
    local_108.fParams.noDictIDFlag = 0;
    local_108.maxBlockSize = (srcCCtx->appliedParams).maxBlockSize;
    local_108.cParams.hashLog = uVar5;
    local_108.cParams.searchLog = uVar6;
    local_108.cParams.minMatch = uVar7;
    local_108.fParams._0_8_ = (ulong)(pledgedSrcSize_00 != 0xffffffffffffffff);
    ZSTD_resetCCtx_internal(dstCCtx,&local_108,pledgedSrcSize_00,0,ZSTDcrp_leaveDirty,zbuff);
    (dstCCtx->workspace).tableValidEnd = (dstCCtx->workspace).objectEnd;
    ZVar1 = (srcCCtx->appliedParams).cParams.strategy;
    if (ZVar1 != ZSTD_fast) {
      if ((ZVar1 - ZSTD_greedy < 3) &&
         ((srcCCtx->appliedParams).useRowMatchFinder == ZSTD_ps_enable)) {
        local_110 = 0;
      }
      else {
        local_110 = 4L << ((byte)(srcCCtx->appliedParams).cParams.chainLog & 0x3f);
      }
    }
    UVar2 = (srcCCtx->blockState).matchState.hashLog3;
    switchD_012bc561::default
              ((dstCCtx->blockState).matchState.hashTable,(srcCCtx->blockState).matchState.hashTable
               ,4L << ((byte)(srcCCtx->appliedParams).cParams.hashLog & 0x3f));
    switchD_012bc561::default
              ((dstCCtx->blockState).matchState.chainTable,
               (srcCCtx->blockState).matchState.chainTable,local_110);
    __n = 0;
    if (UVar2 != 0) {
      __n = 4L << ((byte)UVar2 & 0x3f);
    }
    switchD_012bc561::default
              ((dstCCtx->blockState).matchState.hashTable3,
               (srcCCtx->blockState).matchState.hashTable3,__n);
    pvVar3 = (dstCCtx->workspace).tableEnd;
    if ((dstCCtx->workspace).tableValidEnd < pvVar3) {
      (dstCCtx->workspace).tableValidEnd = pvVar3;
    }
    uVar10 = *(undefined4 *)&(srcCCtx->blockState).matchState.window.field_0x24;
    (dstCCtx->blockState).matchState.window.nbOverflowCorrections =
         (srcCCtx->blockState).matchState.window.nbOverflowCorrections;
    *(undefined4 *)&(dstCCtx->blockState).matchState.window.field_0x24 = uVar10;
    pBVar8 = (srcCCtx->blockState).matchState.window.nextSrc;
    pBVar9 = (srcCCtx->blockState).matchState.window.base;
    UVar2 = (srcCCtx->blockState).matchState.window.dictLimit;
    UVar11 = (srcCCtx->blockState).matchState.window.lowLimit;
    (dstCCtx->blockState).matchState.window.dictBase =
         (srcCCtx->blockState).matchState.window.dictBase;
    (dstCCtx->blockState).matchState.window.dictLimit = UVar2;
    (dstCCtx->blockState).matchState.window.lowLimit = UVar11;
    (dstCCtx->blockState).matchState.window.nextSrc = pBVar8;
    (dstCCtx->blockState).matchState.window.base = pBVar9;
    UVar2 = (srcCCtx->blockState).matchState.nextToUpdate;
    (dstCCtx->blockState).matchState.loadedDictEnd = (srcCCtx->blockState).matchState.loadedDictEnd;
    (dstCCtx->blockState).matchState.nextToUpdate = UVar2;
    dstCCtx->dictID = srcCCtx->dictID;
    dstCCtx->dictContentSize = srcCCtx->dictContentSize;
    switchD_012bc561::default
              ((dstCCtx->blockState).prevCBlock,(srcCCtx->blockState).prevCBlock,0x1600);
    sVar12 = 0;
  }
  return sVar12;
}

Assistant:

size_t ZSTD_copyCCtx(ZSTD_CCtx* dstCCtx, const ZSTD_CCtx* srcCCtx, unsigned long long pledgedSrcSize)
{
    ZSTD_frameParameters fParams = { 1 /*content*/, 0 /*checksum*/, 0 /*noDictID*/ };
    ZSTD_buffered_policy_e const zbuff = srcCCtx->bufferedPolicy;
    ZSTD_STATIC_ASSERT((U32)ZSTDb_buffered==1);
    if (pledgedSrcSize==0) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    fParams.contentSizeFlag = (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN);

    return ZSTD_copyCCtx_internal(dstCCtx, srcCCtx,
                                fParams, pledgedSrcSize,
                                zbuff);
}